

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_scheduler.c
# Opt level: O2

HT_DurationNs ht_task_scheduler_get_optimal_tick_period(HT_TaskScheduler *task_scheduler)

{
  HT_DurationNs HVar1;
  HT_DurationNs HVar2;
  HT_DurationNs HVar3;
  ulong uVar4;
  size_t sVar5;
  bool bVar6;
  
  HVar1 = 0;
  for (sVar5 = 0; sVar5 != (task_scheduler->tasks).size; sVar5 = sVar5 + 1) {
    HVar3 = *(HT_DurationNs *)((long)(task_scheduler->tasks).data[sVar5] + 0x10);
    if ((HVar3 != 0) && (bVar6 = HVar1 != 0, HVar2 = HVar1, HVar1 = HVar3, bVar6)) {
      while (HVar1 = HVar2, HVar3 != 0) {
        uVar4 = HVar2 % HVar3;
        HVar2 = HVar3;
        HVar3 = uVar4;
      }
    }
  }
  return HVar1;
}

Assistant:

HT_DurationNs
ht_task_scheduler_get_optimal_tick_period(HT_TaskScheduler* task_scheduler)
{
    size_t task_pos;
    HT_DurationNs perfect_period = 0;

    for (task_pos = 0; task_pos < task_scheduler->tasks.size; task_pos++)
    {
        HT_DurationNs task_period = HT_TASK(task_scheduler->tasks.data[task_pos])->period;

        if (task_period == 0)
        {
            continue;
        }

        perfect_period = perfect_period == 0 ? task_period : _greatest_common_divisor(perfect_period, task_period);
    }

    return perfect_period;
}